

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

void __thiscall w3Interp::Invoke(w3Interp *this,w3Function *function)

{
  w3InstructionEnum wVar1;
  w3FunctionType *pwVar2;
  w3DecodedInstruction *pwVar3;
  w3DecodedInstruction *pwVar4;
  uint8_t *puVar5;
  w3FunctionType *pwVar6;
  size_type sVar7;
  pointer pwVar8;
  reference __src;
  reference __dest;
  reference pvVar9;
  w3StackValue *pwVar10;
  reference pvVar11;
  w3DecodedInstruction *end;
  w3DecodedInstruction *previous;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_150;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_148;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_140;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_138;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_130;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_128;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_120;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_118;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_110;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_108;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_100;
  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
  local_f8;
  uint8_t *local_f0;
  size_t j;
  size_t i;
  w3StackValue ret;
  w3Frame frame_value;
  size_t size;
  uint8_t *cursor;
  size_t param_count;
  size_t local_only_count;
  w3Code *code;
  w3FunctionType *function_type;
  size_t function_type_index;
  w3Function *function_local;
  w3Interp *this_local;
  
  pwVar2 = (w3FunctionType *)function->function_type_index;
  function_type = pwVar2;
  function_type_index = (size_t)function;
  function_local = (w3Function *)this;
  pwVar6 = (w3FunctionType *)
           std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::size
                     (&this->module->function_types);
  if (pwVar6 <= pwVar2) {
    AssertFailed("function_type_index < module->function_types.size ()");
  }
  code = (w3Code *)
         std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::operator[]
                   (&this->module->function_types,(size_type)function_type);
  local_only_count =
       (size_t)std::vector<w3Code,_std::allocator<w3Code>_>::operator[]
                         (&this->module->code,*(size_type *)function_type_index);
  param_count = std::vector<w3Tag,_std::allocator<w3Tag>_>::size
                          (&((reference)local_only_count)->locals);
  cursor = (uint8_t *)
           std::vector<w3Tag,_std::allocator<w3Tag>_>::size
                     ((vector<w3Tag,_std::allocator<w3Tag>_> *)code);
  size = *(size_t *)(local_only_count + 8);
  if (size != 0) {
    DecodeFunction(this->module,(w3Code *)local_only_count,(uint8_t **)&size);
    *(undefined8 *)(local_only_count + 8) = 0;
  }
  sVar7 = std::vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>::size
                    ((vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_> *)
                     (local_only_count + 0x28));
  if (sVar7 == 0) {
    AssertFailed("size");
  }
  w3Stack::DumpStack(&this->super_w3Stack,"invoke1");
  w3Frame::w3Frame((w3Frame *)&ret.label.continuation);
  ret.label.continuation = *(size_t *)function_type_index;
  if (param_count != 0) {
    std::vector<w3Tag,_std::allocator<w3Tag>_>::operator[]
              ((vector<w3Tag,_std::allocator<w3Tag>_> *)(local_only_count + 0x10),0);
  }
  if (cursor != (uint8_t *)0x0) {
    std::vector<w3Tag,_std::allocator<w3Tag>_>::operator[]
              ((vector<w3Tag,_std::allocator<w3Tag>_> *)code,0);
  }
  w3StackValue::w3StackValue((w3StackValue *)&i,this->frame);
  this->frame = (w3Frame *)&ret.label.continuation;
  w3Stack::push_frame(&this->super_w3Stack,(w3StackValue *)&i);
  w3Stack::DumpStack(&this->super_w3Stack,"pushed_frame");
  j = 0;
  for (local_f0 = (uint8_t *)0x0; puVar5 = local_f0, local_f0 != cursor; local_f0 = local_f0 + 1) {
    local_108._M_current = (w3StackValue *)w3Stack::end(&this->super_w3Stack);
    local_100 = __gnu_cxx::
                __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
                ::operator-(&local_108,(difference_type)cursor);
    local_f8 = __gnu_cxx::
               __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
               ::operator+(&local_100,(difference_type)local_f0);
    pwVar8 = __gnu_cxx::
             __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
             ::operator->(&local_f8);
    printf("2 entering function with param [%lX] type %X\n",puVar5,(ulong)(pwVar8->value).tag);
  }
  if (cursor != (uint8_t *)0x0) {
    for (j = 0; j < cursor; j = j + 1) {
      w3Stack::DumpStack(&this->super_w3Stack,"moved_param_before");
      local_120._M_current = (w3StackValue *)w3Stack::end(&this->super_w3Stack);
      local_118 = __gnu_cxx::
                  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
                  ::operator-(&local_120,2);
      local_110 = __gnu_cxx::
                  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
                  ::operator-(&local_118,j);
      __src = __gnu_cxx::
              __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
              ::operator*(&local_110);
      local_138._M_current = (w3StackValue *)w3Stack::end(&this->super_w3Stack);
      local_130 = __gnu_cxx::
                  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
                  ::operator-(&local_138,1);
      local_128 = __gnu_cxx::
                  __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
                  ::operator-(&local_130,j);
      __dest = __gnu_cxx::
               __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
               ::operator*(&local_128);
      memcpy(__dest,__src,0x30);
      w3Stack::DumpStack(&this->super_w3Stack,"moved_param_after");
    }
  }
  local_150._M_current = (w3StackValue *)w3Stack::end(&this->super_w3Stack);
  local_148 = __gnu_cxx::
              __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
              ::operator-(&local_150,1);
  local_140 = __gnu_cxx::
              __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
              ::operator-(&local_148,(difference_type)cursor);
  pwVar8 = __gnu_cxx::
           __normal_iterator<w3StackValue_*,_std::vector<w3StackValue,_std::allocator<w3StackValue>_>_>
           ::operator->(&local_140);
  pwVar8->tag = Tag_Frame;
  w3Stack::DumpStack(&this->super_w3Stack,"push_locals_before");
  for (j = 0; j != param_count; j = j + 1) {
    pvVar9 = std::vector<w3Tag,_std::allocator<w3Tag>_>::operator[]
                       ((vector<w3Tag,_std::allocator<w3Tag>_> *)(local_only_count + 0x10),j);
    w3StackValue::w3StackValue((w3StackValue *)&previous,*pvVar9);
    w3Stack::push_value(&this->super_w3Stack,(w3StackValue *)&previous);
  }
  w3Stack::DumpStack(&this->super_w3Stack,"push_locals_after");
  w3Stack::size(this->stack);
  for (local_f0 = (uint8_t *)0x0; puVar5 = local_f0, local_f0 != cursor + param_count;
      local_f0 = local_f0 + 1) {
    pwVar10 = w3Frame::Local((w3Frame *)&ret.label.continuation,(size_t)local_f0);
    printf("2 entering function with local [%lX] type %X\n",puVar5,(ulong)(pwVar10->value).tag);
  }
  pwVar3 = (this->super_Wasm).instr;
  pvVar11 = std::vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>::operator[]
                      ((vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_> *)
                       (local_only_count + 0x28),0);
  (this->super_Wasm).instr = pvVar11;
  pwVar4 = (this->super_Wasm).instr;
  while ((this->super_Wasm).instr < pwVar4 + sVar7) {
    if ((this->super_Wasm).instr == (w3DecodedInstruction *)0x0) {
      AssertFailed("instr");
    }
    switch((((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).name) {
    case Unreach:
      printf("interp%s x:%X u:%u i:%i\n","Unreach",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Unreach(this);
      break;
    case Nop:
      printf("interp%s x:%X u:%u i:%i\n","Nop",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Nop(this);
      break;
    case Block:
      printf("interp%s x:%X u:%u i:%i\n","Block",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Block(this);
      break;
    case Loop:
      printf("interp%s x:%X u:%u i:%i\n","Loop",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Loop(this);
      break;
    case If:
      printf("interp%s x:%X u:%u i:%i\n","If",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      If(this);
      break;
    case Else:
      printf("interp%s x:%X u:%u i:%i\n","Else",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Else(this);
      break;
    case Reserved06:
      printf("interp%s x:%X u:%u i:%i\n","Reserved06",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved06(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved07:
      printf("interp%s x:%X u:%u i:%i\n","Reserved07",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved07(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved08:
      printf("interp%s x:%X u:%u i:%i\n","Reserved08",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved08(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved09:
      printf("interp%s x:%X u:%u i:%i\n","Reserved09",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved09(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved0A:
      printf("interp%s x:%X u:%u i:%i\n","Reserved0A",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved0A(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case BlockEnd:
      printf("interp%s x:%X u:%u i:%i\n","BlockEnd",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      BlockEnd(this);
      break;
    case Br:
      printf("interp%s x:%X u:%u i:%i\n","Br",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Br(this);
      break;
    case BrIf:
      printf("interp%s x:%X u:%u i:%i\n","BrIf",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      BrIf(this);
      break;
    case BrTable:
      printf("interp%s x:%X u:%u i:%i\n","BrTable",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      BrTable(this);
      break;
    case Ret:
      printf("interp%s x:%X u:%u i:%i\n","Ret",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ret(this);
      break;
    case Call:
      printf("interp%s x:%X u:%u i:%i\n","Call",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Call(this);
      break;
    case Calli:
      printf("interp%s x:%X u:%u i:%i\n","Calli",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Calli(this);
      break;
    case Reserved12:
      printf("interp%s x:%X u:%u i:%i\n","Reserved12",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved12(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved13:
      printf("interp%s x:%X u:%u i:%i\n","Reserved13",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved13(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved14:
      printf("interp%s x:%X u:%u i:%i\n","Reserved14",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved14(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved15:
      printf("interp%s x:%X u:%u i:%i\n","Reserved15",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved15(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved16:
      printf("interp%s x:%X u:%u i:%i\n","Reserved16",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved16(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved17:
      printf("interp%s x:%X u:%u i:%i\n","Reserved17",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved17(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved18:
      printf("interp%s x:%X u:%u i:%i\n","Reserved18",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved18(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved19:
      printf("interp%s x:%X u:%u i:%i\n","Reserved19",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved19(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Drop:
      printf("interp%s x:%X u:%u i:%i\n","Drop",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Drop(this);
      break;
    case Select:
      printf("interp%s x:%X u:%u i:%i\n","Select",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Select(this);
      break;
    case Reserved1C:
      printf("interp%s x:%X u:%u i:%i\n","Reserved1C",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved1C(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved1D:
      printf("interp%s x:%X u:%u i:%i\n","Reserved1D",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved1D(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved1E:
      printf("interp%s x:%X u:%u i:%i\n","Reserved1E",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved1E(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved1F:
      printf("interp%s x:%X u:%u i:%i\n","Reserved1F",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved1F(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Local_get:
      printf("interp%s x:%X u:%u i:%i\n","Local_get",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Local_get(this);
      break;
    case Local_set:
      printf("interp%s x:%X u:%u i:%i\n","Local_set",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Local_set(this);
      break;
    case Local_tee:
      printf("interp%s x:%X u:%u i:%i\n","Local_tee",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Local_tee(this);
      break;
    case Global_get:
      printf("interp%s x:%X u:%u i:%i\n","Global_get",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Global_get(this);
      break;
    case Global_set:
      printf("interp%s x:%X u:%u i:%i\n","Global_set",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Global_set(this);
      break;
    case Reserved25:
      printf("interp%s x:%X u:%u i:%i\n","Reserved25",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved25(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved26:
      printf("interp%s x:%X u:%u i:%i\n","Reserved26",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved26(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case Reserved27:
      printf("interp%s x:%X u:%u i:%i\n","Reserved27",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Reserved27(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case i32_Load_:
      printf("interp%s x:%X u:%u i:%i\n","i32_Load_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Load_(this);
      break;
    case i64_Load_:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load_(this);
      break;
    case f32_Load_:
      printf("interp%s x:%X u:%u i:%i\n","f32_Load_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Load_(this);
      break;
    case f64_Load_:
      printf("interp%s x:%X u:%u i:%i\n","f64_Load_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Load_(this);
      break;
    case i32_Load8s:
      printf("interp%s x:%X u:%u i:%i\n","i32_Load8s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Load8s(this);
      break;
    case i32_Load8u:
      printf("interp%s x:%X u:%u i:%i\n","i32_Load8u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Load8u(this);
      break;
    case i32_Load16s:
      printf("interp%s x:%X u:%u i:%i\n","i32_Load16s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Load16s(this);
      break;
    case i32_Load16u:
      printf("interp%s x:%X u:%u i:%i\n","i32_Load16u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Load16u(this);
      break;
    case i64_Load8s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load8s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load8s(this);
      break;
    case i64_Load8u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load8u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load8u(this);
      break;
    case i64_Load16s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load16s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load16s(this);
      break;
    case i64_Load16u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load16u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load16u(this);
      break;
    case i64_Load32s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load32s(this);
      break;
    case i64_Load32u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Load32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Load32u(this);
      break;
    case i32_Store_:
      printf("interp%s x:%X u:%u i:%i\n","i32_Store_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Store_(this);
      break;
    case i64_Store_:
      printf("interp%s x:%X u:%u i:%i\n","i64_Store_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Store_(this);
      break;
    case f32_Store_:
      printf("interp%s x:%X u:%u i:%i\n","f32_Store_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Store_(this);
      break;
    case f64_Store_:
      printf("interp%s x:%X u:%u i:%i\n","f64_Store_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Store_(this);
      break;
    case i32_Store8:
      printf("interp%s x:%X u:%u i:%i\n","i32_Store8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Store8(this);
      break;
    case i32_Store16:
      printf("interp%s x:%X u:%u i:%i\n","i32_Store16",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Store16(this);
      break;
    case i64_Store8:
      printf("interp%s x:%X u:%u i:%i\n","i64_Store8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Store8(this);
      break;
    case i64_Store16:
      printf("interp%s x:%X u:%u i:%i\n","i64_Store16",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Store16(this);
      break;
    case i64_Store32:
      printf("interp%s x:%X u:%u i:%i\n","i64_Store32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Store32(this);
      break;
    case MemSize:
      printf("interp%s x:%X u:%u i:%i\n","MemSize",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      MemSize(this);
      break;
    case MemGrow:
      printf("interp%s x:%X u:%u i:%i\n","MemGrow",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      MemGrow(this);
      break;
    case i32_Const:
      printf("interp%s x:%X u:%u i:%i\n","i32_Const",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Const(this);
      break;
    case i64_Const:
      printf("interp%s x:%X u:%u i:%i\n","i64_Const",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Const(this);
      break;
    case f32_Const:
      printf("interp%s x:%X u:%u i:%i\n","f32_Const",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Const(this);
      break;
    case f64_Const:
      printf("interp%s x:%X u:%u i:%i\n","f64_Const",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Const(this);
      break;
    case Eqz_i32:
      printf("interp%s x:%X u:%u i:%i\n","Eqz_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eqz_i32(this);
      break;
    case Eq_i32_:
      printf("interp%s x:%X u:%u i:%i\n","Eq_i32_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eq_i32_(this);
      break;
    case Ne_i32_:
      printf("interp%s x:%X u:%u i:%i\n","Ne_i32_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ne_i32_(this);
      break;
    case Lt_i32s:
      printf("interp%s x:%X u:%u i:%i\n","Lt_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_i32s(this);
      break;
    case Lt_i32u:
      printf("interp%s x:%X u:%u i:%i\n","Lt_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_i32u(this);
      break;
    case Gt_i32s:
      printf("interp%s x:%X u:%u i:%i\n","Gt_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_i32s(this);
      break;
    case Gt_i32u:
      printf("interp%s x:%X u:%u i:%i\n","Gt_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_i32u(this);
      break;
    case Le_i32s:
      printf("interp%s x:%X u:%u i:%i\n","Le_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_i32s(this);
      break;
    case Le_i32u:
      printf("interp%s x:%X u:%u i:%i\n","Le_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_i32u(this);
      break;
    case Ge_i32s:
      printf("interp%s x:%X u:%u i:%i\n","Ge_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_i32s(this);
      break;
    case Ge_i32u:
      printf("interp%s x:%X u:%u i:%i\n","Ge_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_i32u(this);
      break;
    case Eqz_i64:
      printf("interp%s x:%X u:%u i:%i\n","Eqz_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eqz_i64(this);
      break;
    case Eq_i64_:
      printf("interp%s x:%X u:%u i:%i\n","Eq_i64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eq_i64_(this);
      break;
    case Ne_i64_:
      printf("interp%s x:%X u:%u i:%i\n","Ne_i64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ne_i64_(this);
      break;
    case Lt_i64s:
      printf("interp%s x:%X u:%u i:%i\n","Lt_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_i64s(this);
      break;
    case Lt_i64u:
      printf("interp%s x:%X u:%u i:%i\n","Lt_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_i64u(this);
      break;
    case Gt_i64s:
      printf("interp%s x:%X u:%u i:%i\n","Gt_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_i64s(this);
      break;
    case Gt_i64u:
      printf("interp%s x:%X u:%u i:%i\n","Gt_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_i64u(this);
      break;
    case Le_i64s:
      printf("interp%s x:%X u:%u i:%i\n","Le_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_i64s(this);
      break;
    case Le_i64u:
      printf("interp%s x:%X u:%u i:%i\n","Le_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_i64u(this);
      break;
    case Ge_i64s:
      printf("interp%s x:%X u:%u i:%i\n","Ge_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_i64s(this);
      break;
    case Ge_i64u:
      printf("interp%s x:%X u:%u i:%i\n","Ge_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_i64u(this);
      break;
    case Eq_f32:
      printf("interp%s x:%X u:%u i:%i\n","Eq_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eq_f32(this);
      break;
    case Ne_f32:
      printf("interp%s x:%X u:%u i:%i\n","Ne_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ne_f32(this);
      break;
    case Lt_f32:
      printf("interp%s x:%X u:%u i:%i\n","Lt_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_f32(this);
      break;
    case Gt_f32:
      printf("interp%s x:%X u:%u i:%i\n","Gt_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_f32(this);
      break;
    case Le_f32:
      printf("interp%s x:%X u:%u i:%i\n","Le_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_f32(this);
      break;
    case Ge_f32:
      printf("interp%s x:%X u:%u i:%i\n","Ge_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_f32(this);
      break;
    case Eq_f64:
      printf("interp%s x:%X u:%u i:%i\n","Eq_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Eq_f64(this);
      break;
    case Ne_f64:
      printf("interp%s x:%X u:%u i:%i\n","Ne_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ne_f64(this);
      break;
    case Lt_f64:
      printf("interp%s x:%X u:%u i:%i\n","Lt_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Lt_f64(this);
      break;
    case Gt_f64:
      printf("interp%s x:%X u:%u i:%i\n","Gt_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Gt_f64(this);
      break;
    case Le_f64:
      printf("interp%s x:%X u:%u i:%i\n","Le_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Le_f64(this);
      break;
    case Ge_f64:
      printf("interp%s x:%X u:%u i:%i\n","Ge_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ge_f64(this);
      break;
    case CountLeadingZeros_i32:
      printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountLeadingZeros_i32(this);
      break;
    case CountTrailingZeros_i32:
      printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountTrailingZeros_i32(this);
      break;
    case CountSetBits_i32:
      printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountSetBits_i32(this);
      break;
    case Add_i32:
      printf("interp%s x:%X u:%u i:%i\n","Add_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Add_i32(this);
      break;
    case Sub_i32:
      printf("interp%s x:%X u:%u i:%i\n","Sub_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sub_i32(this);
      break;
    case Mul_i32:
      printf("interp%s x:%X u:%u i:%i\n","Mul_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Mul_i32(this);
      break;
    case Div_s_i32:
      printf("interp%s x:%X u:%u i:%i\n","Div_s_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_s_i32(this);
      break;
    case Div_u_i32:
      printf("interp%s x:%X u:%u i:%i\n","Div_u_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_u_i32(this);
      break;
    case Rem_s_i32:
      printf("interp%s x:%X u:%u i:%i\n","Rem_s_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rem_s_i32(this);
      break;
    case Rem_u_i32:
      printf("interp%s x:%X u:%u i:%i\n","Rem_u_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rem_u_i32(this);
      break;
    case And_i32:
      printf("interp%s x:%X u:%u i:%i\n","And_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      And_i32(this);
      break;
    case Or_i32:
      printf("interp%s x:%X u:%u i:%i\n","Or_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Or_i32(this);
      break;
    case Xor_i32:
      printf("interp%s x:%X u:%u i:%i\n","Xor_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Xor_i32(this);
      break;
    case Shl_i32:
      printf("interp%s x:%X u:%u i:%i\n","Shl_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shl_i32(this);
      break;
    case Shr_s_i32:
      printf("interp%s x:%X u:%u i:%i\n","Shr_s_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shr_s_i32(this);
      break;
    case Shr_u_i32:
      printf("interp%s x:%X u:%u i:%i\n","Shr_u_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shr_u_i32(this);
      break;
    case Rotl_i32:
      printf("interp%s x:%X u:%u i:%i\n","Rotl_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rotl_i32(this);
      break;
    case Rotr_i32:
      printf("interp%s x:%X u:%u i:%i\n","Rotr_i32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rotr_i32(this);
      break;
    case CountLeadingZeros_i64:
      printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountLeadingZeros_i64(this);
      break;
    case CountTrailingZeros_i64:
      printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountTrailingZeros_i64(this);
      break;
    case CountSetBits_i64:
      printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      CountSetBits_i64(this);
      break;
    case Add_i64:
      printf("interp%s x:%X u:%u i:%i\n","Add_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Add_i64(this);
      break;
    case Sub_i64:
      printf("interp%s x:%X u:%u i:%i\n","Sub_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sub_i64(this);
      break;
    case Mul_i64:
      printf("interp%s x:%X u:%u i:%i\n","Mul_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Mul_i64(this);
      break;
    case Div_s_i64:
      printf("interp%s x:%X u:%u i:%i\n","Div_s_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_s_i64(this);
      break;
    case Div_u_i64:
      printf("interp%s x:%X u:%u i:%i\n","Div_u_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_u_i64(this);
      break;
    case Rem_s_i64:
      printf("interp%s x:%X u:%u i:%i\n","Rem_s_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rem_s_i64(this);
      break;
    case Rem_u_i64:
      printf("interp%s x:%X u:%u i:%i\n","Rem_u_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rem_u_i64(this);
      break;
    case And_i64:
      printf("interp%s x:%X u:%u i:%i\n","And_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      And_i64(this);
      break;
    case Or_i64:
      printf("interp%s x:%X u:%u i:%i\n","Or_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Or_i64(this);
      break;
    case Xor_i64:
      printf("interp%s x:%X u:%u i:%i\n","Xor_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Xor_i64(this);
      break;
    case Shl_i64:
      printf("interp%s x:%X u:%u i:%i\n","Shl_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shl_i64(this);
      break;
    case Shr_s_i64:
      printf("interp%s x:%X u:%u i:%i\n","Shr_s_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shr_s_i64(this);
      break;
    case Shr_u_i64:
      printf("interp%s x:%X u:%u i:%i\n","Shr_u_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Shr_u_i64(this);
      break;
    case Rotl_i64:
      printf("interp%s x:%X u:%u i:%i\n","Rotl_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rotl_i64(this);
      break;
    case Rotr_i64:
      printf("interp%s x:%X u:%u i:%i\n","Rotr_i64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Rotr_i64(this);
      break;
    case Abs_f32:
      printf("interp%s x:%X u:%u i:%i\n","Abs_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Abs_f32(this);
      break;
    case Neg_f32:
      printf("interp%s x:%X u:%u i:%i\n","Neg_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Neg_f32(this);
      break;
    case Ceil_f32:
      printf("interp%s x:%X u:%u i:%i\n","Ceil_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ceil_f32(this);
      break;
    case Floor_f32:
      printf("interp%s x:%X u:%u i:%i\n","Floor_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Floor_f32(this);
      break;
    case Trunc_f32:
      printf("interp%s x:%X u:%u i:%i\n","Trunc_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Trunc_f32(this);
      break;
    case Nearest_f32:
      printf("interp%s x:%X u:%u i:%i\n","Nearest_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Nearest_f32(this);
      break;
    case Sqrt_f32:
      printf("interp%s x:%X u:%u i:%i\n","Sqrt_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sqrt_f32(this);
      break;
    case Add_f32:
      printf("interp%s x:%X u:%u i:%i\n","Add_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Add_f32(this);
      break;
    case Sub_f32:
      printf("interp%s x:%X u:%u i:%i\n","Sub_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sub_f32(this);
      break;
    case Mul_f32:
      printf("interp%s x:%X u:%u i:%i\n","Mul_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Mul_f32(this);
      break;
    case Div_f32:
      printf("interp%s x:%X u:%u i:%i\n","Div_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_f32(this);
      break;
    case Min_f32:
      printf("interp%s x:%X u:%u i:%i\n","Min_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Min_f32(this);
      break;
    case Max_f32:
      printf("interp%s x:%X u:%u i:%i\n","Max_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Max_f32(this);
      break;
    case Copysign_f32:
      printf("interp%s x:%X u:%u i:%i\n","Copysign_f32",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Copysign_f32(this);
      break;
    case Abs_f64:
      printf("interp%s x:%X u:%u i:%i\n","Abs_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Abs_f64(this);
      break;
    case Neg_f64:
      printf("interp%s x:%X u:%u i:%i\n","Neg_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Neg_f64(this);
      break;
    case Ceil_f64:
      printf("interp%s x:%X u:%u i:%i\n","Ceil_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Ceil_f64(this);
      break;
    case Floor_f64:
      printf("interp%s x:%X u:%u i:%i\n","Floor_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Floor_f64(this);
      break;
    case Trunc_f64:
      printf("interp%s x:%X u:%u i:%i\n","Trunc_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Trunc_f64(this);
      break;
    case Nearest_f64:
      printf("interp%s x:%X u:%u i:%i\n","Nearest_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Nearest_f64(this);
      break;
    case Sqrt_f64:
      printf("interp%s x:%X u:%u i:%i\n","Sqrt_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sqrt_f64(this);
      break;
    case Add_f64:
      printf("interp%s x:%X u:%u i:%i\n","Add_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Add_f64(this);
      break;
    case Sub_f64:
      printf("interp%s x:%X u:%u i:%i\n","Sub_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Sub_f64(this);
      break;
    case Mul_f64:
      printf("interp%s x:%X u:%u i:%i\n","Mul_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Mul_f64(this);
      break;
    case Div_f64:
      printf("interp%s x:%X u:%u i:%i\n","Div_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Div_f64(this);
      break;
    case Min_f64:
      printf("interp%s x:%X u:%u i:%i\n","Min_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Min_f64(this);
      break;
    case Max_f64:
      printf("interp%s x:%X u:%u i:%i\n","Max_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Max_f64(this);
      break;
    case Copysign_f64:
      printf("interp%s x:%X u:%u i:%i\n","Copysign_f64",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      Copysign_f64(this);
      break;
    case i32_Wrap_i64_:
      printf("interp%s x:%X u:%u i:%i\n","i32_Wrap_i64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Wrap_i64_(this);
      break;
    case i32_Trunc_f32s:
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Trunc_f32s(this);
      break;
    case i32_Trunc_f32u:
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Trunc_f32u(this);
      break;
    case i32_Trunc_f64s:
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Trunc_f64s(this);
      break;
    case i32_Trunc_f64u:
      printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Trunc_f64u(this);
      break;
    case i64_Extend_i32s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Extend_i32s(this);
      break;
    case i64_Extend_i32u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Extend_i32u(this);
      break;
    case i64_Trunc_f32s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Trunc_f32s(this);
      break;
    case i64_Trunc_f32u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Trunc_f32u(this);
      break;
    case i64_Trunc_f64s:
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Trunc_f64s(this);
      break;
    case i64_Trunc_f64u:
      printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Trunc_f64u(this);
      break;
    case f32_Convert_i32u:
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Convert_i32u(this);
      break;
    case f32_Convert_i32s:
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Convert_i32s(this);
      break;
    case f32_Convert_i64u:
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Convert_i64u(this);
      break;
    case f32_Convert_i64s:
      printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Convert_i64s(this);
      break;
    case f32_Demote_f64_:
      printf("interp%s x:%X u:%u i:%i\n","f32_Demote_f64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Demote_f64_(this);
      break;
    case f64_Convert_i32s:
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Convert_i32s(this);
      break;
    case f64_Convert_i32u:
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Convert_i32u(this);
      break;
    case f64_Convert_i64s:
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64s",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Convert_i64s(this);
      break;
    case f64_Convert_i64u:
      printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64u",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Convert_i64u(this);
      break;
    case f64_Promote_f32_:
      printf("interp%s x:%X u:%u i:%i\n","f64_Promote_f32_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Promote_f32_(this);
      break;
    case i32_Reinterpret_f32_:
      printf("interp%s x:%X u:%u i:%i\n","i32_Reinterpret_f32_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i32_Reinterpret_f32_(this);
      break;
    case i64_Reinterpret_f64_:
      printf("interp%s x:%X u:%u i:%i\n","i64_Reinterpret_f64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      i64_Reinterpret_f64_(this);
      break;
    case f32_Reinterpret_i32_:
      printf("interp%s x:%X u:%u i:%i\n","f32_Reinterpret_i32_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f32_Reinterpret_i32_(this);
      break;
    case f64_Reinterpret_i64_:
      printf("interp%s x:%X u:%u i:%i\n","f64_Reinterpret_i64_",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      f64_Reinterpret_i64_(this);
      break;
    case ReservedC0:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC0",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC0(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC1:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC1",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC1(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC2:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC2",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC2(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC3:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC3",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC3(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC4:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC4",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC4(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC5:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC5",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC5(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC6:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC6",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC6(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC7:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC7",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC7(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC8:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC8(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedC9:
      printf("interp%s x:%X u:%u i:%i\n","ReservedC9",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedC9(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCA:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCA",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCA(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCB:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCB",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCB(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCC:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCC",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCC(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCD:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCD",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCD(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCE:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCE",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCE(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedCF:
      printf("interp%s x:%X u:%u i:%i\n","ReservedCF",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedCF(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD0:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD0",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD0(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD1:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD1",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD1(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD2:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD2",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD2(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD3:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD3",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD3(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD4:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD4",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD4(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD5:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD5",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD5(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD6:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD6",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD6(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD7:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD7",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD7(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD8:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD8(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedD9:
      printf("interp%s x:%X u:%u i:%i\n","ReservedD9",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedD9(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDA:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDA",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDA(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDB:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDB",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDB(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDC:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDC",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDC(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDD:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDD",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDD(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDE:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDE",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDE(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedDF:
      printf("interp%s x:%X u:%u i:%i\n","ReservedDF",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedDF(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE0:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE0",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE0(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE1:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE1",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE1(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE2:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE2",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE2(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE3:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE3",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE3(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE4:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE4",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE4(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE5:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE5",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE5(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE6:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE6",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE6(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE7:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE7",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE7(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE8:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE8(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedE9:
      printf("interp%s x:%X u:%u i:%i\n","ReservedE9",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedE9(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedEA:
      printf("interp%s x:%X u:%u i:%i\n","ReservedEA",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedEA(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedEB:
      printf("interp%s x:%X u:%u i:%i\n","ReservedEB",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedEB(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedEC:
      printf("interp%s x:%X u:%u i:%i\n","ReservedEC",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedEC(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedED:
      printf("interp%s x:%X u:%u i:%i\n","ReservedED",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedED(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedEE:
      printf("interp%s x:%X u:%u i:%i\n","ReservedEE",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedEE(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedEF:
      printf("interp%s x:%X u:%u i:%i\n","ReservedEF",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedEF(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF0:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF0",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF0(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF1:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF1",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF1(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF2:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF2",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF2(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF3:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF3",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF3(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF4:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF4",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF4(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF5:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF5",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF5(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF6:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF6",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF6(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF7:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF7",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF7(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF8:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF8",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF8(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedF9:
      printf("interp%s x:%X u:%u i:%i\n","ReservedF9",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedF9(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFA:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFA",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFA(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFB:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFB",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFB(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFC:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFC",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFC(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFD:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFD",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFD(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFE:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFE",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFE(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
      break;
    case ReservedFF:
      printf("interp%s x:%X u:%u i:%i\n","ReservedFF",
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32,
             (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32);
      ReservedFF(this);
      (*(this->super_Wasm)._vptr_Wasm[2])();
    }
    if ((((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).name == Ret) break;
    wVar1 = (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).name;
    if (wVar1 == Call || wVar1 == Calli) {
      this->frame = (w3Frame *)&ret.label.continuation;
    }
    (this->super_Wasm).instr = (this->super_Wasm).instr + 1;
  }
  (this->super_Wasm).instr = pwVar3;
  return;
}

Assistant:

void w3Interp::Invoke (w3Function& function)
{
    //__debugbreak ();
    // Decode function upon first call.
    // TODO thread safety
    // TODO merge with calli (invoke)

    const size_t function_type_index = function.function_type_index;
    Assert (function_type_index < module->function_types.size ());
    w3FunctionType* function_type = &module->function_types [function_type_index];
    w3Code* code = &module->code [function.function_index];
    const size_t local_only_count = code->locals.size ();
    const size_t param_count = function_type->parameters.size ();

    uint8_t* cursor = code->cursor;
    if (cursor)
    {
        DecodeFunction (module, code, &cursor);
        code->cursor = 0;
    }
    const size_t size = code->decoded_instructions.size ();
    Assert (size);

    DumpStack ("invoke1");

    // TODO cross-module calls
    // TODO calling embedding
    // setup frame
    w3Frame frame_value;
    frame_value.interp = this;
    frame_value.code = code;
    frame_value.module = this->module; // TODO cross module calls
    frame_value.module_instance = this->module_instance; // TODO cross module calls
    frame_value.function_index = function.function_index;
    frame_value.param_count = param_count;
    frame_value.param_and_local_count = local_only_count + param_count; // TODO overflow
    frame_value.local_only_count = local_only_count;
    frame_value.local_only_types = local_only_count ? &code->locals [0] : 0;
    frame_value.param_types = param_count ? &function_type->parameters [0] : 0;
    frame_value.function_type = function_type;

    w3StackValue ret (frame);
    this->frame = &frame_value;
    push_frame (ret);
    DumpStack ("pushed_frame");

    size_t i = 0;
    size_t j = 0;

    for (j = 0; j != param_count; ++j)
    {
        printf ("2 entering function with param [%" FORMAT_SIZE "X] type %X\n", j, (end () - (ssize_t)param_count + (ssize_t)j)->value.tag);
    }

    // CONSIDER put the interp loop elsewhere
    // Invoke would adjust member data and return to it

    // params are subsumed into new frame

    // TODO We really want this to be more efficient.
    // Either by having split stacks, or by computing
    // maximum parameter count and putting return before it.

    // For now live with memcpy or slower (stack is not presently contiguous)..

    if (param_count)
    {
        for (i = 0; i < param_count; ++i)
        {
            DumpStack ("moved_param_before");
            *(end () - 1 - (ssize_t)i) = *(end () - 2 - (ssize_t)i);
            DumpStack ("moved_param_after");
        }
    }

    // place return frame/address (frame is just a marker now, the data is on the native stack)

    (end () - 1 - (ssize_t)param_count)->tag = Tag_Frame;
    //(end () - 1 - param_count)->frame = frame;
    //(end () - 1 - param_count)->instr = instr + !!instr;

    // Push locals on stack.
    // TODO params also
    // TODO reserve (size () + local_only_count);
    DumpStack ("push_locals_before");
    for (i = 0; i != local_only_count; ++i)
        push_value (w3StackValue (code->locals [i]));

    DumpStack ("push_locals_after");
    // Provide for indexing locals.
    frame_value.locals = stack.size () - local_only_count - param_count;

    for (j = 0; j != local_only_count + param_count; ++j)
        printf ("2 entering function with local [%" FORMAT_SIZE "X] type %X\n", j, frame_value.Local (j).value.tag);

    //DumpStack ("invoke2");

    // TODO provide for separate depth -- i.e. here is now 0; locals/params cannot be popped

    w3DecodedInstruction* previous = instr; // call/ret handling
    instr = &code->decoded_instructions [0];
    w3DecodedInstruction* end = instr + size;
    for (; instr < end; ++instr) // Br subtracts one so this works.
    {
        Assert (instr);
        switch (instr->name)
        {
            // break before instead of after to avoid unreachable code warning
#undef RESERVED
#define RESERVED(b0) INSTRUCTION (0x ## b0, 0, 0, Reserved ## b0, Imm_none, 0, 0, Tag_none, Tag_none, Tag_none, Tag_none) { Reserved (); }

#undef INSTRUCTION
#define INSTRUCTION(byte0, fixed_size, byte1, name, imm, pop, push, in0, in1, in2, out0)     \
            break;                                                                           \
            case ::name:                                                                   \
            printf ("interp%s x:%X u:%u i:%i\n", #name, instr->u32, instr->u32, instr->u32); \
            this->name ();
#include "w3Instructions.h"
        }
        // special handling
        if (instr->name == ::Ret) // gross but most choices are
            break;
#include "diag-switch-push.h"
        switch (instr->name)
        {
        case ::Call:
        case ::Calli:
            frame = &frame_value; // TODO should handled in Ret.
            break;
        }
#include "diag-switch-pop.h"
    }
    instr = previous;
    // TODO handle ret
    //__debugbreak ();
}